

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O1

bool slang::ast::CallExpression::bindArgs
               (ArgumentListSyntax *argSyntax,
               span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
               formalArgs,string_view symbolName,SourceRange range,ASTContext *context,
               SmallVectorBase<const_slang::ast::Expression_*> *boundArgs)

{
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
  *psVar1;
  long lVar2;
  SyntaxNode *this;
  bool bVar3;
  bool bVar4;
  Diagnostic *pDVar5;
  PropertyExprSyntax *pPVar6;
  ExpressionSyntax *pEVar7;
  Type *pTVar8;
  iterator iVar9;
  SourceLocation SVar10;
  long lVar11;
  ulong uVar12;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
  *psVar13;
  long lVar14;
  char *pcVar15;
  byte bVar16;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
  *psVar17;
  string_view arg;
  string_view arg_00;
  SourceRange sourceRange;
  SourceRange SVar18;
  string_view sVar19;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  NamedArgMap namedArgs;
  Expression *local_230;
  ulong local_228;
  Token local_220;
  size_type local_210;
  size_t local_208;
  char *local_200;
  SourceLocation local_1f8;
  SourceLocation local_1f0;
  pointer local_1e8;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> local_1e0 [2];
  NamedArgMap local_1a0;
  
  pcVar15 = symbolName._M_str;
  local_208 = symbolName._M_len;
  local_210 = formalArgs.size_;
  local_1e8 = formalArgs.data_;
  local_1e0[0].data_ = (pointer)local_1e0[0].firstElement;
  local_1e0[0].len = 0;
  local_1e0[0].cap = 5;
  local_1a0.
  super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>
  .ptr = (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
          *)&local_1a0;
  local_1a0.
  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>
  .storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>
              *)local_1a0.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>
                .ptr;
  local_1a0.
  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .entries = ska::detailv3::
             empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>>
                       ();
  local_1a0.
  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .num_slots_minus_one = 0;
  local_1a0.
  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .hash_policy.shift = '?';
  local_1a0.
  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .max_lookups = '\x03';
  local_1a0.
  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  ._max_load_factor = 0.5;
  local_1a0.
  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  .num_elements = 0;
  if ((argSyntax == (ArgumentListSyntax *)0x0) ||
     (bVar4 = Expression::collectArgs(context,argSyntax,local_1e0,&local_1a0), bVar4)) {
    uVar12 = 0;
    if (local_210 == 0) {
      bVar16 = 0;
    }
    else {
      local_228 = 0;
      local_1f0 = range.startLoc;
      local_1f8 = range.endLoc;
      lVar11 = local_210 * 8;
      bVar16 = 0;
      lVar14 = 0;
      local_200 = pcVar15;
      do {
        lVar2 = *(long *)((long)local_1e8 + lVar14);
        local_230 = (Expression *)0x0;
        if ((local_228 & 0xffffffff) < local_1e0[0].len) {
          this = *(SyntaxNode **)((long)local_1e0[0].data_ + (local_228 & 0xffffffff) * 8);
          if (this->kind == EmptyArgument) {
            local_230 = DeclaredType::getInitializer((DeclaredType *)(lVar2 + 0x40));
            if (local_230 == (Expression *)0x0) {
              SVar18 = slang::syntax::SyntaxNode::sourceRange(this);
              pDVar5 = ASTContext::addDiag(context,(DiagCode)0x7,SVar18);
              Diagnostic::operator<<(pDVar5,*(string_view *)(lVar2 + 8));
            }
          }
          else {
            pPVar6 = slang::syntax::SyntaxNode::as<slang::syntax::PropertyExprSyntax>(this);
            pEVar7 = ASTContext::requireSimpleExpr(context,pPVar6);
            if (pEVar7 != (ExpressionSyntax *)0x0) {
              pTVar8 = DeclaredType::getType((DeclaredType *)(lVar2 + 0x40));
              local_230 = Expression::bindArgument
                                    (pTVar8,*(ArgumentDirection *)(lVar2 + 0x90),pEVar7,context,
                                     (bool)((byte)*(undefined2 *)(lVar2 + 0x8c) & 1));
            }
          }
          iVar9 = ska::detailv3::
                  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                  ::find(&local_1a0.
                          super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                          .
                          super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                         ,(basic_string_view<char,_std::char_traits<char>_> *)(lVar2 + 8));
          local_228 = (ulong)((int)local_228 + 1);
          if (iVar9.current !=
              local_1a0.
              super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .entries +
              local_1a0.
              super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .num_slots_minus_one +
              (long)local_1a0.
                    super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                    .
                    super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                    .max_lookups) {
            SVar10 = parsing::Token::location
                               (&(((iVar9.current)->field_1).value.second.first)->name);
            pDVar5 = ASTContext::addDiag(context,(DiagCode)0x410007,SVar10);
            Diagnostic::operator<<(pDVar5,*(string_view *)(lVar2 + 8));
            local_220 = slang::syntax::SyntaxNode::getFirstToken(this);
            SVar10 = parsing::Token::location(&local_220);
            Diagnostic::addNote(pDVar5,(DiagCode)0xa0001,SVar10);
            *(undefined1 *)((long)&(iVar9.current)->field_1 + 0x18) = 1;
            bVar16 = 1;
          }
LAB_0039a716:
          bVar3 = false;
          if (local_230 == (Expression *)0x0) {
            bVar16 = 1;
          }
          else {
            bVar4 = Expression::bad(local_230);
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)boundArgs,&local_230);
            bVar16 = bVar16 | bVar4;
            bVar3 = false;
          }
        }
        else {
          iVar9 = ska::detailv3::
                  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                  ::find(&local_1a0.
                          super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                          .
                          super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                         ,(basic_string_view<char,_std::char_traits<char>_> *)(lVar2 + 8));
          if (iVar9.current ==
              local_1a0.
              super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .entries +
              local_1a0.
              super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .num_slots_minus_one +
              (long)local_1a0.
                    super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                    .
                    super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                    .max_lookups) {
            local_230 = DeclaredType::getInitializer((DeclaredType *)(lVar2 + 0x40));
            bVar3 = false;
            bVar4 = true;
            if (local_230 == (Expression *)0x0) {
              if (local_1a0.
                  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                  .
                  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                  .num_elements == 0) {
                SVar18.endLoc = local_1f8;
                SVar18.startLoc = local_1f0;
                pDVar5 = ASTContext::addDiag(context,(DiagCode)0x8c0007,SVar18);
                sVar19._M_str = local_200;
                sVar19._M_len = local_208;
                Diagnostic::operator<<(pDVar5,sVar19);
                local_220.kind = (undefined2)local_210;
                local_220._2_1_ = local_210._2_1_;
                local_220.numFlags.raw = local_210._3_1_;
                local_220.rawLen = local_210._4_4_;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                ::emplace_back<unsigned_long>(&pDVar5->args,(unsigned_long *)&local_220);
                local_220.kind = (undefined2)local_1e0[0].len;
                local_220._2_1_ = local_1e0[0].len._2_1_;
                local_220.numFlags.raw = local_1e0[0].len._3_1_;
                local_220.rawLen = local_1e0[0].len._4_4_;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                ::emplace_back<unsigned_long>(&pDVar5->args,(unsigned_long *)&local_220);
                bVar3 = true;
                bVar16 = 1;
                bVar4 = false;
              }
              else {
                sourceRange.endLoc = local_1f8;
                sourceRange.startLoc = local_1f0;
                pDVar5 = ASTContext::addDiag(context,(DiagCode)0x8f0007,sourceRange);
                Diagnostic::operator<<(pDVar5,*(string_view *)(lVar2 + 8));
              }
            }
          }
          else {
            *(undefined1 *)((long)&(iVar9.current)->field_1 + 0x18) = 1;
            pPVar6 = (((iVar9.current)->field_1).value.second.first)->expr;
            if (pPVar6 == (PropertyExprSyntax *)0x0) {
              local_230 = DeclaredType::getInitializer((DeclaredType *)(lVar2 + 0x40));
              bVar3 = false;
              if (local_230 == (Expression *)0x0) {
                SVar18 = slang::syntax::SyntaxNode::sourceRange
                                   ((SyntaxNode *)((iVar9.current)->field_1).value.second.first);
                bVar4 = true;
                pDVar5 = ASTContext::addDiag(context,(DiagCode)0x7,SVar18);
                Diagnostic::operator<<(pDVar5,*(string_view *)(lVar2 + 8));
                goto LAB_0039a711;
              }
            }
            else {
              pEVar7 = ASTContext::requireSimpleExpr(context,pPVar6);
              if (pEVar7 != (ExpressionSyntax *)0x0) {
                pTVar8 = DeclaredType::getType((DeclaredType *)(lVar2 + 0x40));
                local_230 = Expression::bindArgument
                                      (pTVar8,*(ArgumentDirection *)(lVar2 + 0x90),pEVar7,context,
                                       (bool)((byte)*(undefined2 *)(lVar2 + 0x8c) & 1));
              }
            }
            bVar3 = false;
            bVar4 = true;
          }
LAB_0039a711:
          if (bVar4) goto LAB_0039a716;
        }
      } while ((!bVar3) && (bVar4 = lVar11 + -8 != lVar14, lVar14 = lVar14 + 8, bVar4));
      uVar12 = local_228 & 0xffffffff;
      pcVar15 = local_200;
    }
    if (uVar12 < local_1e0[0].len) {
      pDVar5 = ASTContext::addDiag(context,(DiagCode)0x8d0007,range);
      arg._M_str = pcVar15;
      arg._M_len = local_208;
      Diagnostic::operator<<(pDVar5,arg);
      local_220.kind = (undefined2)local_210;
      local_220._2_1_ = local_210._2_1_;
      local_220.numFlags.raw = local_210._3_1_;
      local_220.rawLen = local_210._4_4_;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::emplace_back<unsigned_long>(&pDVar5->args,(unsigned_long *)&local_220);
      local_220.kind = (undefined2)local_1e0[0].len;
      local_220._2_1_ = local_1e0[0].len._2_1_;
      local_220.numFlags.raw = local_1e0[0].len._3_1_;
      local_220.rawLen = local_1e0[0].len._4_4_;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::emplace_back<unsigned_long>(&pDVar5->args,(unsigned_long *)&local_220);
      bVar16 = 1;
    }
    psVar13 = local_1a0.
              super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .entries + -1;
    lVar11 = 0x28;
    do {
      lVar11 = lVar11 + -0x28;
      psVar17 = psVar13 + 1;
      psVar13 = psVar13 + 1;
    } while (psVar17->distance_from_desired < '\0');
    if (local_1a0.
        super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
        .
        super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
        .num_slots_minus_one * 0x28 +
        (long)local_1a0.
              super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .max_lookups * 0x28 + lVar11 != 0) {
      psVar17 = local_1a0.
                super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                .
                super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                .entries +
                local_1a0.
                super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                .
                super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                .num_slots_minus_one +
                (long)local_1a0.
                      super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                      .
                      super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
                      .max_lookups;
      do {
        if (*(char *)((long)&psVar13->field_1 + 0x18) == '\0') {
          SVar10 = parsing::Token::location(&((psVar13->field_1).value.second.first)->name);
          pDVar5 = ASTContext::addDiag(context,(DiagCode)0x10007,SVar10);
          sVar19 = parsing::Token::valueText(&((psVar13->field_1).value.second.first)->name);
          Diagnostic::operator<<(pDVar5,sVar19);
          bVar16 = 1;
          arg_00._M_str = pcVar15;
          arg_00._M_len = local_208;
          Diagnostic::operator<<(pDVar5,arg_00);
        }
        do {
          psVar1 = psVar13 + 1;
          psVar13 = psVar13 + 1;
        } while (psVar1->distance_from_desired < '\0');
      } while (psVar13 != psVar17);
    }
    bVar4 = (bool)(bVar16 ^ 1);
  }
  else {
    bVar4 = false;
  }
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
  ::~sherwood_v3_table
            (&local_1a0.
              super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>,_8UL>_>
            );
  if (local_1e0[0].data_ != (pointer)local_1e0[0].firstElement) {
    free(local_1e0[0].data_);
  }
  return bVar4;
}

Assistant:

bool CallExpression::bindArgs(const ArgumentListSyntax* argSyntax,
                              span<const FormalArgumentSymbol* const> formalArgs,
                              string_view symbolName, SourceRange range, const ASTContext& context,
                              SmallVectorBase<const Expression*>& boundArgs) {
    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (argSyntax) {
        if (!collectArgs(context, *argSyntax, orderedArgs, namedArgs))
            return false;
    }

    bool bad = false;
    uint32_t orderedIndex = 0;
    for (auto formal : formalArgs) {
        const Expression* expr = nullptr;
        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getInitializer();
                if (!expr)
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
            }
            else if (auto exSyn = context.requireSimpleExpr(arg->as<PropertyExprSyntax>())) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction, *exSyn,
                                                 context, formal->flags.has(VariableFlags::Const));
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            auto arg = it->second.first->expr;
            if (!arg) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getInitializer();
                if (!expr) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
            }
            else if (auto exSyn = context.requireSimpleExpr(*arg)) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction, *exSyn,
                                                 context, formal->flags.has(VariableFlags::Const));
            }
        }
        else {
            expr = formal->getInitializer();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbolName;
                    diag << formalArgs.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
        }

        if (!expr) {
            bad = true;
        }
        else {
            bad |= expr->bad();
            boundArgs.push_back(expr);
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbolName;
        diag << formalArgs.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (const auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbolName;
            bad = true;
        }
    }

    return !bad;
}